

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qxdgnotificationproxy_p.cpp
# Opt level: O2

void QXdgNotificationInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QDBusPendingReply<QString,_QString,_QString,_QString> _r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    bVar2 = QtMocHelpers::
            indexOfMethod<void(QXdgNotificationInterface::*)(unsigned_int,QString_const&)>
                      ((QtMocHelpers *)_a,(void **)ActionInvoked,0,0);
    if (!bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        QtMocHelpers::indexOfMethod<void(QXdgNotificationInterface::*)(unsigned_int,unsigned_int)>
                  ((QtMocHelpers *)_a,(void **)NotificationClosed,0,1);
        return;
      }
      goto LAB_005a4636;
    }
    goto switchD_005a4408_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_005a4408_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ActionInvoked((QXdgNotificationInterface *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    goto LAB_005a4636;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      NotificationClosed((QXdgNotificationInterface *)_o,*_a[1],*_a[2]);
      return;
    }
    goto LAB_005a4636;
  case 2:
    _r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    closeNotification((QDBusPendingReply<> *)&_r,(QXdgNotificationInterface *)_o,*_a[1]);
    if ((QDBusPendingReply<> *)*_a != (QDBusPendingReply<> *)0x0) {
      QDBusPendingReply<>::assign((QDBusPendingReply<> *)*_a,(QDBusPendingCall *)&_r);
    }
    break;
  case 3:
    _r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    getCapabilities((QDBusPendingReply<QList<QString>_> *)&_r,(QXdgNotificationInterface *)_o);
    if ((QDBusPendingReply<QList<QString>_> *)*_a != (QDBusPendingReply<QList<QString>_> *)0x0) {
      QDBusPendingReply<QList<QString>_>::assign
                ((QDBusPendingReply<QList<QString>_> *)*_a,(QDBusPendingCall *)&_r);
    }
    break;
  case 4:
    _r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    getServerInformation(&_r,(QXdgNotificationInterface *)_o);
    if ((QDBusPendingReply<QString,_QString,_QString,_QString> *)*_a !=
        (QDBusPendingReply<QString,_QString,_QString,_QString> *)0x0) {
      QDBusPendingReply<QString,_QString,_QString,_QString>::assign
                ((QDBusPendingReply<QString,_QString,_QString,_QString> *)*_a,
                 (QDBusPendingCall *)&_r);
    }
    break;
  case 5:
    _r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    getServerInformation
              ((QDBusReply<QString> *)&_r,(QXdgNotificationInterface *)_o,(QString *)_a[1],
               (QString *)_a[2],(QString *)_a[3]);
    if ((QDBusReply<QString> *)*_a != (QDBusReply<QString> *)0x0) {
      QDBusReply<QString>::operator=((QDBusReply<QString> *)*_a,(QDBusReply<QString> *)&_r);
    }
    QDBusReply<QString>::~QDBusReply((QDBusReply<QString> *)&_r);
    goto switchD_005a4408_default;
  case 6:
    _r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    notify((QDBusPendingReply<unsigned_int> *)&_r,(QXdgNotificationInterface *)_o,(QString *)_a[1],
           *_a[2],(QString *)_a[3],(QString *)_a[4],(QString *)_a[5],(QStringList *)_a[6],
           (QVariantMap *)_a[7],*_a[8]);
    if ((QDBusPendingReply<unsigned_int> *)*_a != (QDBusPendingReply<unsigned_int> *)0x0) {
      QDBusPendingReply<unsigned_int>::assign
                ((QDBusPendingReply<unsigned_int> *)*_a,(QDBusPendingCall *)&_r);
    }
    break;
  default:
    goto switchD_005a4408_default;
  }
  QDBusPendingReplyBase::~QDBusPendingReplyBase(&_r.super_QDBusPendingReplyBase);
switchD_005a4408_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005a4636:
  __stack_chk_fail();
}

Assistant:

void QXdgNotificationInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QXdgNotificationInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ActionInvoked((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->NotificationClosed((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 2: { QDBusPendingReply<> _r = _t->closeNotification((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QStringList> _r = _t->getCapabilities();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QStringList>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<QString,QString,QString,QString> _r = _t->getServerInformation();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QString,QString,QString>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusReply<QString> _r = _t->getServerInformation((*reinterpret_cast< std::add_pointer_t<QString&>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingReply<uint> _r = _t->notify((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<QVariantMap>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[8])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<uint>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , const QString & )>(_a, &QXdgNotificationInterface::ActionInvoked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , uint )>(_a, &QXdgNotificationInterface::NotificationClosed, 1))
            return;
    }
}